

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

size_t __thiscall adios2::transport::FileStdio::GetSize(FileStdio *this)

{
  long in_RDI;
  long size;
  long currentPosition;
  char *in_stack_fffffffffffffe30;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_198 [8];
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  string *in_stack_fffffffffffffe78;
  FileStdio *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  allocator local_151;
  string local_150 [39];
  undefined1 local_129 [40];
  allocator local_101;
  string local_100 [32];
  size_t local_e0;
  string local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  
  WaitForOpen(in_stack_fffffffffffffe80);
  local_10 = ftell(*(FILE **)(in_RDI + 0xf0));
  if (local_10 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Toolkit",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"transport::file::FileStdio",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"GetSize",&local_91);
    std::operator+((char *)in_stack_fffffffffffffe78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (string *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               in_stack_fffffffffffffe74);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  fseek(*(FILE **)(in_RDI + 0xf0),0,2);
  local_e0 = ftell(*(FILE **)(in_RDI + 0xf0));
  if (local_e0 == 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"Toolkit",&local_101);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_129 + 1),"transport::file::FileStdio",(allocator *)__lhs);
    __rhs = &local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"GetSize",__rhs);
    std::operator+((char *)in_stack_fffffffffffffe78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    std::operator+(__lhs,(char *)__rhs);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (string *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               in_stack_fffffffffffffe74);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::__cxx11::string::~string((string *)(local_129 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  fseek(*(FILE **)(in_RDI + 0xf0),local_10,0);
  return local_e0;
}

Assistant:

size_t FileStdio::GetSize()
{
    WaitForOpen();
    const auto currentPosition = ftell(m_File);
    if (currentPosition == -1L)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "GetSize",
                                              "couldn't get current position of " + m_Name +
                                                  " file, in call to FileStdio GetSize ftell");
    }

    fseek(m_File, 0, SEEK_END);
    const auto size = ftell(m_File);
    if (size == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "GetSize",
                                              "couldn't get size of " + m_Name +
                                                  " file, in call to FileStdio GetSize ftell");
    }
    fseek(m_File, currentPosition, SEEK_SET);
    return static_cast<size_t>(size);
}